

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::ClientContext::Query(ClientContext *this,string *query,bool allow_stream_result)

{
  StatementReturnType SVar1;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> _Var2;
  bool bVar3;
  type pCVar4;
  reference pvVar5;
  pointer pPVar6;
  type lock_00;
  QueryResult *pQVar7;
  Allocator *args;
  byte in_CL;
  undefined7 in_register_00000011;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> _Var8;
  ulong __n;
  bool bVar9;
  StatementType local_2e1;
  ClientContext *local_2e0;
  templated_unique_single_t collection;
  undefined1 local_2d0 [8];
  undefined1 local_2c8 [8];
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true> lock;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
  statements;
  _Head_base<0UL,_duckdb::Logger_*,_false> local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [3];
  undefined1 local_238 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_220;
  float local_218;
  tuple<duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
  local_210;
  undefined1 auStack_208 [48];
  _Alloc_hider local_1d8;
  __node_base _Stack_1d0;
  undefined1 local_1c8 [24];
  ErrorData error;
  ErrorData local_130;
  ErrorData local_b0;
  
  local_2e0 = (ClientContext *)query;
  make_uniq<duckdb::ClientContextLock,std::mutex&>((duckdb *)&lock,(mutex *)(query + 0x12));
  ErrorData::ErrorData(&error);
  statements.
  super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  statements.
  super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  statements.
  super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar4 = unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
           ::operator*(&lock);
  bVar3 = ParseStatements(local_2e0,pCVar4,
                          (string *)CONCAT71(in_register_00000011,allow_stream_result),&statements,
                          &error);
  if (bVar3) {
    if (statements.
        super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        statements.
        super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_238._0_8_ = auStack_208;
      local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
      local_238._16_8_ = (element_type *)0x0;
      _Stack_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_218 = 1.0;
      local_210.
      super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
      .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
            )(_Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>)0x0;
      auStack_208._0_8_ = (tuple<duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>)0x0;
      auStack_208._8_8_ = &_Stack_1d0;
      auStack_208._16_8_ = (element_type *)0x1;
      auStack_208._24_8_ = (__buckets_ptr)0x0;
      auStack_208._32_8_ = 0;
      auStack_208._40_4_ = 1.0;
      local_1d8._M_p = (pointer)0x0;
      _Stack_1d0._M_nxt = (_Hash_node_base *)0x0;
      local_1c8._0_4_ = 0x10001;
      local_1c8._8_8_ = (__node_base_ptr)0x0;
      local_1c8[0x10] = false;
      names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      args = Allocator::DefaultAllocator();
      make_uniq<duckdb::ColumnDataCollection,duckdb::Allocator&>((duckdb *)&collection,args);
      local_2e1 = INVALID_STATEMENT;
      GetClientProperties((ClientProperties *)local_268,local_2e0);
      make_uniq<duckdb::MaterializedQueryResult,duckdb::StatementType,duckdb::StatementProperties&,duckdb::vector<std::__cxx11::string,true>,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>,duckdb::ClientProperties>
                ((duckdb *)local_2c8,&local_2e1,(StatementProperties *)local_238,&names,&collection,
                 (ClientProperties *)local_268);
      (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_2c8;
      local_2c8 = (undefined1  [8])0x0;
      ::std::__cxx11::string::~string((string *)local_268[0]._M_local_buf);
      ::std::
      unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>::
      ~unique_ptr(&collection.
                   super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                 );
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&names);
      StatementProperties::~StatementProperties((StatementProperties *)local_238);
    }
    else {
      (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bVar3 = false;
      local_298._M_head_impl = (Logger *)0x0;
      __n = 0;
      do {
        if ((ulong)((long)statements.
                          super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)statements.
                          super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) break;
        pvVar5 = vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                 ::get<true>(&statements,__n);
        __n = __n + 1;
        local_268[0]._M_allocated_capacity = 0;
        local_268[0]._8_1_ =
             __n == (long)statements.
                          super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)statements.
                          super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3 & in_CL;
        pCVar4 = unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                 ::operator*(&lock);
        local_2d0 = (undefined1  [8])
                    (pvVar5->
                    super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
                    .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
        (pvVar5->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)
        ._M_t.
        super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
        super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
        PendingQueryInternal
                  ((ClientContext *)&collection,(ClientContextLock *)local_2e0,
                   (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                    *)pCVar4,(PendingQueryParameters *)local_2d0,SUB81(local_268,0));
        if (local_2d0 != (undefined1  [8])0x0) {
          (*(*(_func_int ***)local_2d0)[1])();
        }
        local_2d0 = (undefined1  [8])0x0;
        pPVar6 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                 ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                               *)&collection);
        SVar1 = (pPVar6->super_BaseQueryResult).properties.return_type;
        pPVar6 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                 ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                               *)&collection);
        if ((pPVar6->super_BaseQueryResult).success == false) {
          pPVar6 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                   ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                                 *)&collection);
          ErrorData::ErrorData(&local_b0,&(pPVar6->super_BaseQueryResult).error);
          local_238._0_8_ = local_238 + 0x10;
          local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
          ErrorResult<duckdb::MaterializedQueryResult>
                    ((ClientContext *)local_2c8,(ErrorData *)local_2e0,(string *)&local_b0);
          _Var8._M_head_impl = (QueryResult *)local_2c8;
          local_2c8 = (undefined1  [8])0x0;
          ::std::__cxx11::string::~string((string *)local_238);
          ErrorData::~ErrorData(&local_b0);
        }
        else {
          unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
          ::operator*(&lock);
          lock_00 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                    ::operator*((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                                 *)&collection);
          PendingQueryResult::ExecuteInternal
                    ((PendingQueryResult *)local_238,(ClientContextLock *)lock_00);
          _Var8._M_head_impl = (QueryResult *)local_238._0_8_;
        }
        if ((bool)(names.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0 & bVar3)) {
          if (SVar1 == QUERY_RESULT) {
            pQVar7 = optional_ptr<duckdb::QueryResult,_true>::operator->
                               ((optional_ptr<duckdb::QueryResult,_true> *)&names);
            _Var2._M_head_impl =
                 (pQVar7->next).
                 super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>.
                 _M_t.
                 super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>
                 .super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl;
            (pQVar7->next).
            super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
            super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>.
            _M_t.
            super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>
            .super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl = _Var8._M_head_impl;
            if (_Var2._M_head_impl != (QueryResult *)0x0) {
              (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseQueryResult + 8))();
            }
            pQVar7 = optional_ptr<duckdb::QueryResult,_true>::operator->
                               ((optional_ptr<duckdb::QueryResult,_true> *)&names);
            _Var8._M_head_impl =
                 (pQVar7->next).
                 super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>.
                 _M_t.
                 super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>
                 .super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl;
            _Var2._M_head_impl = (QueryResult *)local_298;
            bVar3 = true;
            goto LAB_019bf748;
          }
          bVar3 = true;
          if (_Var8._M_head_impl != (QueryResult *)0x0) {
            (**(code **)(*(long *)&(_Var8._M_head_impl)->super_BaseQueryResult + 8))
                      (_Var8._M_head_impl);
          }
          bVar9 = false;
        }
        else {
          (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
          super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)_Var8._M_head_impl;
          _Var2._M_head_impl = _Var8._M_head_impl;
          bVar3 = SVar1 == QUERY_RESULT;
          if ((_Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>)
              local_298._M_head_impl != (Logger *)0x0) {
            (**(code **)(*(long *)local_298._M_head_impl + 8))();
          }
LAB_019bf748:
          local_298._M_head_impl = (Logger *)_Var2._M_head_impl;
          names.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var8._M_head_impl;
          pQVar7 = optional_ptr<duckdb::QueryResult,_true>::operator->
                             ((optional_ptr<duckdb::QueryResult,_true> *)&names);
          bVar9 = (pQVar7->super_BaseQueryResult).success == false;
          if (bVar9) {
            LOCK();
            (local_2e0->interrupted)._M_base._M_i = false;
            UNLOCK();
          }
        }
        if (collection.
            super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
            .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)collection.
                                super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
                                .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>.
                                _M_head_impl + 8))();
        }
      } while (!bVar9);
    }
  }
  else {
    ErrorData::ErrorData(&local_130,&error);
    ErrorResult<duckdb::MaterializedQueryResult>
              ((ClientContext *)local_238,(ErrorData *)local_2e0,(string *)&local_130);
    (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_238._0_8_;
    local_238._0_8_ = (element_type *)0x0;
    ErrorData::~ErrorData(&local_130);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ::~vector(&statements.
             super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
           );
  ErrorData::~ErrorData(&error);
  ::std::unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>::
  ~unique_ptr(&lock.
               super_unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>
             );
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)this;
}

Assistant:

unique_ptr<QueryResult> ClientContext::Query(const string &query, bool allow_stream_result) {
	auto lock = LockContext();

	ErrorData error;
	vector<unique_ptr<SQLStatement>> statements;
	if (!ParseStatements(*lock, query, statements, error)) {
		return ErrorResult<MaterializedQueryResult>(std::move(error), query);
	}
	if (statements.empty()) {
		// no statements, return empty successful result
		StatementProperties properties;
		vector<string> names;
		auto collection = make_uniq<ColumnDataCollection>(Allocator::DefaultAllocator());
		return make_uniq<MaterializedQueryResult>(StatementType::INVALID_STATEMENT, properties, std::move(names),
		                                          std::move(collection), GetClientProperties());
	}

	unique_ptr<QueryResult> result;
	optional_ptr<QueryResult> last_result;
	bool last_had_result = false;
	for (idx_t i = 0; i < statements.size(); i++) {
		auto &statement = statements[i];
		bool is_last_statement = i + 1 == statements.size();
		PendingQueryParameters parameters;
		parameters.allow_stream_result = allow_stream_result && is_last_statement;
		auto pending_query = PendingQueryInternal(*lock, std::move(statement), parameters);
		auto has_result = pending_query->properties.return_type == StatementReturnType::QUERY_RESULT;
		unique_ptr<QueryResult> current_result;
		if (pending_query->HasError()) {
			current_result = ErrorResult<MaterializedQueryResult>(pending_query->GetErrorObject());
		} else {
			current_result = ExecutePendingQueryInternal(*lock, *pending_query);
		}
		// now append the result to the list of results
		if (!last_result || !last_had_result) {
			// first result of the query
			result = std::move(current_result);
			last_result = result.get();
			last_had_result = has_result;
		} else {
			// later results; attach to the result chain
			// but only if there is a result
			if (!has_result) {
				continue;
			}
			last_result->next = std::move(current_result);
			last_result = last_result->next.get();
		}
		D_ASSERT(last_result);
		if (last_result->HasError()) {
			// Reset the interrupted flag, this was set by the task that found the error
			// Next statements should not be bothered by that interruption
			interrupted = false;
			break;
		}
	}
	return result;
}